

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder.cpp
# Opt level: O3

void __thiscall
RenX_LadderPlugin::RenX_OnGameOver
          (RenX_LadderPlugin *this,Server *server,WinType winType,TeamType *team,int gScore,
          int nScore)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  TeamType TVar4;
  char cVar5;
  undefined2 *local_68;
  undefined8 local_60;
  undefined2 local_58;
  undefined6 uStack_56;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined6 uStack_36;
  
  cVar5 = RenX::Server::isRanked();
  if (cVar5 != '\0') {
    cVar5 = RenX::Server::isReliable();
    if (cVar5 != '\0') {
      lVar1 = *(long *)(server + 0x20);
      lVar2 = RenX::Server::getBotCount();
      if (lVar1 != lVar2) {
        TVar4 = *team;
        uVar3 = Jupiter::Config::operator[]
                          (server + 0x70,*(undefined8 *)&this->field_0x20,
                           *(undefined8 *)&this->field_0x18);
        local_40 = 1;
        uStack_37 = 0;
        local_48 = &local_38;
        local_38 = (char)TVar4;
        Jupiter::Config::set(uVar3,1,"t",&local_48);
        if (local_48 != &local_38) {
          operator_delete(local_48,CONCAT62(uStack_36,CONCAT11(uStack_37,local_38)) + 1);
        }
        uVar3 = Jupiter::Config::operator[]
                          (server + 0x70,*(undefined8 *)&this->field_0x20,
                           *(undefined8 *)&this->field_0x18);
        local_58 = 0x31;
        local_60 = 1;
        local_68 = &local_58;
        Jupiter::Config::set(uVar3,1,"w",&local_68);
        if (local_68 != &local_58) {
          operator_delete(local_68,CONCAT62(uStack_56,local_58) + 1);
        }
        RenX::Server::updateClientList();
      }
    }
  }
  return;
}

Assistant:

void RenX_LadderPlugin::RenX_OnGameOver(RenX::Server &server, RenX::WinType winType, const RenX::TeamType &team, int gScore, int nScore) {
	if (server.isRanked() && server.isReliable() && server.players.size() != server.getBotCount()) {
		char chr = static_cast<char>(team);
		server.varData[this->name].set("t"sv, std::string(&chr, 1));
		server.varData[this->name].set("w"sv, "1"s);
		server.updateClientList();
	}
}